

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TType * __thiscall
glslang::HlslParseContext::split
          (HlslParseContext *this,TType *type,TString *name,TQualifier *outerQualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  TType *pTVar2;
  TType *type_00;
  char *pcVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar5;
  char cVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar9;
  char *__src;
  char *__dest;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> __str;
  TString local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  iVar7 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar7 != '\0') {
    iVar7 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar7 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
    }
    pTVar2 = (type->field_13).referentType;
    __dest = *(char **)&pTVar2->field_0x8;
    while (__dest != (pTVar2->qualifier).semanticName) {
      cVar6 = (**(code **)(**(long **)__dest + 0x148))();
      type_00 = *(TType **)__dest;
      if (cVar6 == '\0') {
        local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        pcVar4 = (name->_M_dataplus)._M_p;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_58,pcVar4,pcVar4 + name->_M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&local_58,".");
        lVar8 = (**(code **)(**(long **)__dest + 0x30))();
        pbVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                 _M_append(&local_58,*(char **)(lVar8 + 8),*(size_type *)(lVar8 + 0x10));
        local_80._M_dataplus.super_allocator_type.allocator =
             (pbVar9->_M_dataplus).super_allocator_type.allocator;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                  *)(pbVar9->_M_dataplus)._M_p;
        paVar1 = &pbVar9->field_2;
        if (paVar5 == paVar1) {
          local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        }
        else {
          local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_80._M_dataplus._M_p = (pointer)paVar5;
        }
        local_80._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        split(this,type_00,&local_80,outerQualifier);
        __dest = __dest + 0x20;
      }
      else {
        iVar7 = (*type->_vptr_TType[0x13])(type);
        splitBuiltIn(this,name,type_00,(TArraySizes *)CONCAT44(extraout_var,iVar7),outerQualifier);
        __src = __dest + 0x20;
        pcVar3 = (pTVar2->qualifier).semanticName;
        if (__src != pcVar3) {
          memmove(__dest,__src,(long)pcVar3 - (long)__src);
        }
        (pTVar2->qualifier).semanticName = (pTVar2->qualifier).semanticName + -0x20;
      }
    }
  }
  return type;
}

Assistant:

const TType& HlslParseContext::split(const TType& type, const TString& name, const TQualifier& outerQualifier)
{
    if (type.isStruct()) {
        TTypeList* userStructure = type.getWritableStruct();
        for (auto ioType = userStructure->begin(); ioType != userStructure->end(); ) {
            if (ioType->type->isBuiltIn()) {
                // move out the built-in
                splitBuiltIn(name, *ioType->type, type.getArraySizes(), outerQualifier);
                ioType = userStructure->erase(ioType);
            } else {
                split(*ioType->type, name + "." + ioType->type->getFieldName(), outerQualifier);
                ++ioType;
            }
        }
    }

    return type;
}